

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

base_learner * stagewise_poly_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  undefined8 uVar2;
  option_group_definition *poVar3;
  typed_option<float> *op;
  typed_option<unsigned_int> *op_00;
  base_learner *l;
  single_learner *base;
  learner<stagewise_poly,_example> *plVar4;
  bool stage_poly;
  free_ptr<stagewise_poly> poly;
  option_group_definition new_options;
  bool local_411;
  allocator local_410;
  allocator local_40f;
  allocator local_40e;
  allocator local_40d;
  allocator local_40c;
  allocator local_40b;
  allocator local_40a;
  allocator local_409;
  free_ptr<stagewise_poly> local_408;
  string local_3f8 [32];
  string local_3d8;
  string local_3b8 [32];
  string local_398;
  string local_378 [32];
  string local_358;
  string local_338 [32];
  string local_318;
  string local_2f8;
  option_group_definition local_2d8;
  undefined1 local_2a0 [112];
  bool local_230;
  undefined1 local_200 [160];
  typed_option<unsigned_int> local_160;
  typed_option<float> local_c0;
  
  scoped_calloc_or_throw<stagewise_poly>();
  local_411 = false;
  std::__cxx11::string::string
            ((string *)&local_2f8,"Stagewise polynomial options",(allocator *)local_2a0);
  VW::config::option_group_definition::option_group_definition(&local_2d8,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string((string *)&local_318,"stage_poly",&local_409);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2a0,&local_318,&local_411);
  local_230 = true;
  std::__cxx11::string::string(local_338,"use stagewise polynomial feature learning",&local_40a);
  std::__cxx11::string::_M_assign((string *)(local_2a0 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_2d8,(typed_option<bool> *)local_2a0);
  std::__cxx11::string::string((string *)&local_358,"sched_exponent",&local_40b);
  VW::config::typed_option<float>::typed_option
            (&local_c0,&local_358,
             &(local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sched_exponent);
  op = VW::config::typed_option<float>::default_value(&local_c0,1.0);
  std::__cxx11::string::string
            (local_378,"exponent controlling quantity of included features",&local_40c);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,op);
  std::__cxx11::string::string((string *)&local_398,"batch_sz",&local_40d);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_160,&local_398,
             &(local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz);
  op_00 = VW::config::typed_option<unsigned_int>::default_value(&local_160,1000);
  std::__cxx11::string::string
            (local_3b8,"multiplier on batch size before including more features",&local_40e);
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar3,op_00);
  std::__cxx11::string::string((string *)&local_3d8,"batch_sz_no_doubling",&local_40f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_200,&local_3d8,
             &(local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz_double);
  std::__cxx11::string::string(local_3f8,"batch_sz does not double",&local_410);
  std::__cxx11::string::_M_assign((string *)(local_200 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar3,(typed_option<bool> *)local_200);
  std::__cxx11::string::~string(local_3f8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_200);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string(local_3b8);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_160);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string(local_378);
  VW::config::typed_option<float>::~typed_option(&local_c0);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string(local_338);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a0);
  std::__cxx11::string::~string((string *)&local_318);
  (**options->_vptr_options_i)(options,&local_2d8);
  if (local_411 == false) {
    plVar4 = (learner<stagewise_poly,_example> *)0x0;
  }
  else {
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->all = all;
    depthsbits_create(local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl);
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sd = (sort_data *)0x0;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sd_len = 0;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz_double =
         (bool)((local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz_double ^ 1);
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sum_sparsity = 0;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sum_input_sparsity = 0;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->num_examples = 0;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sum_sparsity_sync = 0;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sum_input_sparsity_sync = 0;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->num_examples_sync = 0;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->last_example_counter =
         0xffffffffffffffff;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->numpasses = 1;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->update_support = false;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->original_ec = (example *)0x0;
    (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->next_batch_sz =
         (local_408._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar4 = LEARNER::init_learner<stagewise_poly,example,LEARNER::learner<char,example>>
                       (&local_408,base,learn,predict);
    uVar1 = *(undefined8 *)(plVar4 + 0x18);
    uVar2 = *(undefined8 *)(plVar4 + 0x20);
    *(undefined8 *)(plVar4 + 0xb8) = uVar1;
    *(undefined8 *)(plVar4 + 0xc0) = uVar2;
    *(code **)(plVar4 + 200) = finish;
    *(code **)(plVar4 + 0x80) = save_load;
    *(undefined8 *)(plVar4 + 0x70) = uVar1;
    *(undefined8 *)(plVar4 + 0x78) = uVar2;
    *(undefined8 *)(plVar4 + 0x58) = uVar1;
    *(code **)(plVar4 + 0x68) = finish_example;
    *(undefined8 *)(plVar4 + 0x88) = uVar1;
    *(undefined8 *)(plVar4 + 0x90) = uVar2;
    *(code **)(plVar4 + 0x98) = end_pass;
  }
  VW::config::option_group_definition::~option_group_definition(&local_2d8);
  std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::~unique_ptr(&local_408);
  return (base_learner *)plVar4;
}

Assistant:

base_learner *stagewise_poly_setup(options_i &options, vw &all)
{
  auto poly = scoped_calloc_or_throw<stagewise_poly>();
  bool stage_poly = false;
  option_group_definition new_options("Stagewise polynomial options");
  new_options.add(make_option("stage_poly", stage_poly).keep().help("use stagewise polynomial feature learning"))
      .add(make_option("sched_exponent", poly->sched_exponent)
               .default_value(1.f)
               .help("exponent controlling quantity of included features"))
      .add(make_option("batch_sz", poly->batch_sz)
               .default_value(1000)
               .help("multiplier on batch size before including more features"))
      .add(make_option("batch_sz_no_doubling", poly->batch_sz_double).help("batch_sz does not double"));
#ifdef MAGIC_ARGUMENT
  new_options.add(
      make_typed_option("magic_argument", poly->magic_argument).default_value(0.).help("magical feature flag"));
#endif  // MAGIC_ARGUMENT
  options.add_and_parse(new_options);

  if (!stage_poly)
    return nullptr;

  poly->all = &all;
  depthsbits_create(*poly.get());
  sort_data_create(*poly.get());

  poly->batch_sz_double = !poly->batch_sz_double;

  poly->sum_sparsity = 0;
  poly->sum_input_sparsity = 0;
  poly->num_examples = 0;
  poly->sum_sparsity_sync = 0;
  poly->sum_input_sparsity_sync = 0;
  poly->num_examples_sync = 0;
  poly->last_example_counter = -1;
  poly->numpasses = 1;
  poly->update_support = false;
  poly->original_ec = nullptr;
  poly->next_batch_sz = poly->batch_sz;

  learner<stagewise_poly, example> &l = init_learner(poly, as_singleline(setup_base(options, all)), learn, predict);
  l.set_finish(finish);
  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}